

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlCreateFile(MemJournal *p)

{
  undefined8 *local_88;
  FileChunk *pIter;
  i64 iOff;
  undefined1 local_70 [4];
  int nChunk;
  MemJournal copy;
  sqlite3_file *pReal;
  int rc;
  MemJournal *p_local;
  
  copy.zJournal = (char *)p;
  memcpy(local_70,p,0x50);
  memset(p,0,0x50);
  pReal._4_4_ = sqlite3OsOpen((sqlite3_vfs *)copy._56_8_,(char *)copy.pVfs,
                              (sqlite3_file *)copy.zJournal,(int)copy.readpoint.pChunk,(int *)0x0);
  if (pReal._4_4_ == 0) {
    iOff._4_4_ = (int)copy.pMethod;
    pIter = (FileChunk *)0x0;
    for (local_88 = (undefined8 *)copy._8_8_; local_88 != (undefined8 *)0x0;
        local_88 = (undefined8 *)*local_88) {
      if ((long)copy.pFirst < (long)(pIter->zChunk + (long)iOff._4_4_ + -8)) {
        iOff._4_4_ = (int)copy.pFirst - (int)pIter;
      }
      pReal._4_4_ = sqlite3OsWrite((sqlite3_file *)copy.zJournal,local_88 + 1,iOff._4_4_,(i64)pIter)
      ;
      if (pReal._4_4_ != 0) break;
      pIter = (FileChunk *)(pIter->zChunk + (long)iOff._4_4_ + -8);
    }
    if (pReal._4_4_ == 0) {
      memjrnlFreeChunks((FileChunk *)copy._8_8_);
    }
  }
  if (pReal._4_4_ != 0) {
    sqlite3OsClose((sqlite3_file *)copy.zJournal);
    memcpy(p,local_70,0x50);
  }
  return pReal._4_4_;
}

Assistant:

static int memjrnlCreateFile(MemJournal *p){
  int rc;
  sqlite3_file *pReal = (sqlite3_file*)p;
  MemJournal copy = *p;

  memset(p, 0, sizeof(MemJournal));
  rc = sqlite3OsOpen(copy.pVfs, copy.zJournal, pReal, copy.flags, 0);
  if( rc==SQLITE_OK ){
    int nChunk = copy.nChunkSize;
    i64 iOff = 0;
    FileChunk *pIter;
    for(pIter=copy.pFirst; pIter; pIter=pIter->pNext){
      if( iOff + nChunk > copy.endpoint.iOffset ){
        nChunk = copy.endpoint.iOffset - iOff;
      }
      rc = sqlite3OsWrite(pReal, (u8*)pIter->zChunk, nChunk, iOff);
      if( rc ) break;
      iOff += nChunk;
    }
    if( rc==SQLITE_OK ){
      /* No error has occurred. Free the in-memory buffers. */
      memjrnlFreeChunks(copy.pFirst);
    }
  }
  if( rc!=SQLITE_OK ){
    /* If an error occurred while creating or writing to the file, restore
    ** the original before returning. This way, SQLite uses the in-memory
    ** journal data to roll back changes made to the internal page-cache
    ** before this function was called.  */
    sqlite3OsClose(pReal);
    *p = copy;
  }
  return rc;
}